

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::TypedName>::moveAppend
          (QGenericArrayOps<VkSpecParser::TypedName> *this,TypedName *b,TypedName *e)

{
  qsizetype *pqVar1;
  TypedName *pTVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pTVar2 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
      pDVar4 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pTVar2[lVar3].name.d.d = pDVar4;
      pcVar5 = (b->name).d.ptr;
      (b->name).d.ptr = (char16_t *)0x0;
      pTVar2[lVar3].name.d.ptr = pcVar5;
      qVar6 = (b->name).d.size;
      (b->name).d.size = 0;
      pTVar2[lVar3].name.d.size = qVar6;
      pDVar4 = (b->type).d.d;
      (b->type).d.d = (Data *)0x0;
      pTVar2[lVar3].type.d.d = pDVar4;
      pcVar5 = (b->type).d.ptr;
      (b->type).d.ptr = (char16_t *)0x0;
      pTVar2[lVar3].type.d.ptr = pcVar5;
      qVar6 = (b->type).d.size;
      (b->type).d.size = 0;
      pTVar2[lVar3].type.d.size = qVar6;
      pDVar4 = (b->typeSuffix).d.d;
      (b->typeSuffix).d.d = (Data *)0x0;
      pTVar2[lVar3].typeSuffix.d.d = pDVar4;
      pcVar5 = (b->typeSuffix).d.ptr;
      (b->typeSuffix).d.ptr = (char16_t *)0x0;
      pTVar2[lVar3].typeSuffix.d.ptr = pcVar5;
      qVar6 = (b->typeSuffix).d.size;
      (b->typeSuffix).d.size = 0;
      pTVar2[lVar3].typeSuffix.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }